

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverPJacobi.cpp
# Opt level: O3

double __thiscall chrono::ChSolverPJacobi::Solve(ChSolverPJacobi *this,ChSystemDescriptor *sysd)

{
  int *piVar1;
  undefined1 auVar2 [16];
  ChConstraint *pCVar3;
  ChVariables *this_00;
  ChConstraint *pCVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  pointer ppCVar8;
  pointer ppCVar9;
  ulong uVar10;
  pointer ppCVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  pointer ppCVar15;
  size_type __new_size;
  pointer ppCVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  vector<double,_std::allocator<double>_> delta_gammas;
  double gi_values [3];
  double old_lambda_friction [3];
  undefined1 local_e8 [16];
  vector<double,_std::allocator<double>_> local_c8;
  long local_b0;
  undefined8 uStack_a8;
  double local_a0;
  double local_98 [4];
  double local_78 [3];
  pointer local_60;
  pointer local_58;
  ChVectorRef local_48;
  
  (this->super_ChIterativeSolverVI).m_iterations = 0;
  this->maxviolation = 0.0;
  ppCVar9 = (sysd->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar8 = (sysd->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppCVar9 == ppCVar8) {
    uVar10 = 0;
  }
  else {
    uVar18 = 1;
    uVar14 = 0;
    do {
      uVar12 = uVar18;
      (*ppCVar8[uVar14]->_vptr_ChConstraint[6])();
      ppCVar9 = (sysd->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      ppCVar8 = (sysd->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar10 = (long)ppCVar9 - (long)ppCVar8 >> 3;
      uVar18 = (ulong)((int)uVar12 + 1);
      uVar14 = uVar12;
    } while (uVar12 < uVar10);
  }
  if (uVar10 != 0) {
    uVar13 = 1;
    iVar17 = 0;
    ppCVar16 = ppCVar8;
    do {
      pCVar3 = *ppCVar16;
      if (pCVar3->mode == CONSTRAINT_FRIC) {
        local_98[iVar17] = pCVar3->g_i;
        iVar17 = iVar17 + 1;
        if (iVar17 == 3) {
          dVar30 = (local_98[0] + local_98[1] + local_98[2]) / 3.0;
          ppCVar8[uVar13 - 3]->g_i = dVar30;
          ppCVar8[uVar13 - 2]->g_i = dVar30;
          iVar17 = 0;
          pCVar3->g_i = dVar30;
        }
      }
      uVar18 = (ulong)uVar13;
      ppCVar16 = ppCVar16 + 1;
      uVar13 = uVar13 + 1;
    } while (uVar18 < uVar10);
  }
  ppCVar11 = (sysd->vvariables).
             super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppCVar15 = (sysd->vvariables).
             super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar15 != ppCVar11) {
    uVar13 = 1;
    uVar10 = 0;
    do {
      this_00 = ppCVar11[uVar10];
      if (this_00->disabled == false) {
        ChVariables::Get_qb(&local_48,this_00);
        ChVariables::Get_fb((ChVectorRef *)&local_60,
                            (sysd->vvariables).
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar10]);
        local_b0 = 0;
        uStack_a8 = 0;
        local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = local_60;
        local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_58;
        if ((long)local_58 < 0 && local_60 != (pointer)0x0) {
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                       );
        }
        (*this_00->_vptr_ChVariables[4])(this_00,&local_48,&local_c8);
        if (local_b0 != 0) {
          free(*(void **)(local_b0 + -8));
        }
        ppCVar11 = (sysd->vvariables).
                   super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppCVar15 = (sysd->vvariables).
                   super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar10 = (ulong)uVar13;
      uVar13 = uVar13 + 1;
    } while (uVar10 < (ulong)((long)ppCVar15 - (long)ppCVar11 >> 3));
    ppCVar8 = (sysd->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppCVar9 = (sysd->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  __new_size = (long)ppCVar9 - (long)ppCVar8 >> 3;
  if (((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_warm_start == false) &&
     (ppCVar9 != ppCVar8)) {
    uVar10 = 0;
    do {
      ppCVar9 = ppCVar8 + uVar10;
      uVar10 = uVar10 + 1;
      (*ppCVar9)->l_i = 0.0;
    } while ((uVar10 & 0xffffffff) < __new_size);
  }
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize(&local_c8,__new_size);
  if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations < 1) {
    dVar30 = this->maxviolation;
  }
  else {
    iVar17 = 0;
    uVar13 = 0;
    do {
      this->maxviolation = 0.0;
      auVar37 = ZEXT864(0) << 0x40;
      dVar30 = 0.0;
      ppCVar8 = (sysd->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppCVar9 = (sysd->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppCVar9 == ppCVar8) {
        local_e8._0_8_ = 0.0;
      }
      else {
        local_e8 = ZEXT816(0);
        auVar29 = ZEXT1664(local_e8);
        uVar19 = 1;
        uVar10 = 0;
        do {
          dVar30 = auVar29._0_8_;
          if (ppCVar8[uVar10]->active == true) {
            (*ppCVar8[uVar10]->_vptr_ChConstraint[7])();
            pCVar3 = (sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar10];
            auVar23._8_8_ = 0;
            auVar23._0_8_ = pCVar3->cfm_i;
            auVar2._8_8_ = 0;
            auVar2._0_8_ = pCVar3->l_i;
            auVar32._8_8_ = 0;
            auVar32._0_8_ = dVar30 + pCVar3->b_i;
            auVar2 = vfmadd132sd_fma(auVar23,auVar32,auVar2);
            auVar23 = auVar2;
            (*pCVar3->_vptr_ChConstraint[0xc])();
            ppCVar8 = (sysd->vconstraints).
                      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pCVar3 = ppCVar8[uVar10];
            auVar21._8_8_ = 0x8000000000000000;
            auVar21._0_8_ = 0x8000000000000000;
            auVar21 = vxorpd_avx512vl(auVar2,auVar21);
            dVar30 = pCVar3->l_i;
            dVar22 = ((this->super_ChIterativeSolverVI).m_omega / pCVar3->g_i) * auVar21._0_8_ +
                     dVar30;
            if (pCVar3->mode == CONSTRAINT_FRIC) {
              local_78[iVar17] = dVar30;
              pCVar3->l_i = dVar22;
              if (iVar17 == 0) {
                auVar7._8_8_ = 0x7fffffffffffffff;
                auVar7._0_8_ = 0x7fffffffffffffff;
                auVar21 = vandpd_avx512vl(auVar2,auVar7);
                iVar17 = 1;
                uVar6 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar2,1);
                auVar43._8_8_ = auVar21._8_8_;
                auVar43._0_8_ = (ulong)!(bool)((byte)uVar6 & 1) * auVar21._0_8_;
              }
              else {
                iVar17 = iVar17 + 1;
                auVar43 = SUB6416(ZEXT864(0),0) << 0x40;
                if (iVar17 == 3) {
                  uVar20 = uVar19 - 3;
                  (*ppCVar8[uVar20]->_vptr_ChConstraint[0xb])();
                  ppCVar8 = (sysd->vconstraints).
                            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  dVar30 = (this->super_ChIterativeSolverVI).m_shlambda;
                  auVar44._8_8_ = 0;
                  auVar44._0_8_ = dVar30;
                  pCVar3 = ppCVar8[uVar19 - 2];
                  pCVar4 = ppCVar8[uVar10];
                  dVar22 = ppCVar8[uVar20]->l_i;
                  auVar24._8_8_ = 0;
                  auVar24._0_8_ = dVar22;
                  dVar31 = pCVar3->l_i;
                  auVar33._8_8_ = 0;
                  auVar33._0_8_ = dVar31;
                  dVar38 = pCVar4->l_i;
                  auVar39._8_8_ = 0;
                  auVar39._0_8_ = dVar38;
                  if ((dVar30 != 1.0) || (NAN(dVar30))) {
                    dVar30 = 1.0 - dVar30;
                    auVar46._8_8_ = 0;
                    auVar46._0_8_ = dVar30 * local_78[0];
                    auVar2 = vfmadd213sd_fma(auVar24,auVar44,auVar46);
                    auVar47._8_8_ = 0;
                    auVar47._0_8_ = dVar30 * local_78[1];
                    auVar21 = vfmadd213sd_fma(auVar33,auVar44,auVar47);
                    auVar45._8_8_ = 0;
                    auVar45._0_8_ = dVar30 * local_78[2];
                    auVar23 = vfmadd213sd_fma(auVar39,auVar44,auVar45);
                    dVar22 = auVar2._0_8_;
                    ppCVar8[uVar20]->l_i = dVar22;
                    dVar31 = auVar21._0_8_;
                    pCVar3->l_i = dVar31;
                    dVar38 = auVar23._0_8_;
                    pCVar4->l_i = dVar38;
                  }
                  auVar43 = ZEXT816(0);
                  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar20] = dVar22 - local_78[0];
                  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar19 - 2] = dVar31 - local_78[1];
                  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar10] = dVar38 - local_78[2];
                  iVar17 = 0;
                  if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
                    auVar42._8_8_ = 0x7fffffffffffffff;
                    auVar42._0_8_ = 0x7fffffffffffffff;
                    auVar25._8_8_ = 0;
                    auVar25._0_8_ = dVar22 - local_78[0];
                    auVar2 = vandpd_avx(auVar25,auVar42);
                    auVar34._8_8_ = 0;
                    auVar34._0_8_ = dVar31 - local_78[1];
                    auVar21 = vandpd_avx(auVar34,auVar42);
                    auVar2 = vmaxsd_avx(local_e8,auVar2);
                    auVar21 = vmaxsd_avx(auVar2,auVar21);
                    auVar40._8_8_ = 0;
                    auVar40._0_8_ = dVar38 - local_78[2];
                    auVar2 = vandpd_avx(auVar40,auVar42);
                    local_e8 = vmaxsd_avx(auVar21,auVar2);
                  }
                }
              }
            }
            else {
              pCVar3->l_i = dVar22;
              local_a0 = dVar30;
              (*pCVar3->_vptr_ChConstraint[0xb])();
              ppCVar8 = (sysd->vconstraints).
                        super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              dVar30 = (this->super_ChIterativeSolverVI).m_shlambda;
              auVar35._8_8_ = 0;
              auVar35._0_8_ = dVar30;
              dVar22 = ppCVar8[uVar10]->l_i;
              auVar26._8_8_ = 0;
              auVar26._0_8_ = dVar22;
              if ((dVar30 != 1.0) || (NAN(dVar30))) {
                auVar41._8_8_ = 0;
                auVar41._0_8_ = local_a0 * (1.0 - dVar30);
                auVar2 = vfmadd213sd_fma(auVar26,auVar35,auVar41);
                dVar22 = auVar2._0_8_;
                ppCVar8[uVar10]->l_i = dVar22;
              }
              auVar36._8_8_ = 0x7fffffffffffffff;
              auVar36._0_8_ = 0x7fffffffffffffff;
              auVar43 = vandpd_avx(auVar36,auVar23);
              local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar10] = dVar22 - local_a0;
              if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
                auVar27._8_8_ = 0;
                auVar27._0_8_ = dVar22 - local_a0;
                auVar2 = vandpd_avx(auVar27,auVar36);
                local_e8 = vmaxsd_avx(local_e8,auVar2);
              }
            }
            auVar28._8_8_ = 0;
            auVar28._0_8_ = this->maxviolation;
            auVar29 = ZEXT1664(auVar28);
            auVar2 = vmaxsd_avx(auVar28,auVar43);
            auVar37 = ZEXT1664(auVar2);
            this->maxviolation = auVar2._0_8_;
            ppCVar9 = (sysd->vconstraints).
                      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          dVar30 = auVar37._0_8_;
          uVar10 = (ulong)uVar19;
          uVar19 = uVar19 + 1;
        } while (uVar10 < (ulong)((long)ppCVar9 - (long)ppCVar8 >> 3));
      }
      if (ppCVar9 != ppCVar8) {
        uVar10 = 0;
        uVar18 = 1;
        do {
          if (ppCVar8[uVar10]->active == true) {
            (*ppCVar8[uVar10]->_vptr_ChConstraint[8])
                      (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar10]);
            ppCVar8 = (sysd->vconstraints).
                      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppCVar9 = (sysd->vconstraints).
                      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          bVar5 = uVar18 < (ulong)((long)ppCVar9 - (long)ppCVar8 >> 3);
          uVar10 = uVar18;
          uVar18 = (ulong)((int)uVar18 + 1);
        } while (bVar5);
        dVar30 = this->maxviolation;
      }
      if ((this->super_ChIterativeSolverVI).record_violation_history != false) {
        ChIterativeSolverVI::AtIterationEnd
                  (&this->super_ChIterativeSolverVI,dVar30,(double)local_e8._0_8_,uVar13);
        dVar30 = this->maxviolation;
      }
      piVar1 = &(this->super_ChIterativeSolverVI).m_iterations;
      *piVar1 = *piVar1 + 1;
    } while (((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_tolerance <= dVar30) &&
            (uVar13 = uVar13 + 1,
            (int)uVar13 < (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations
            ));
  }
  if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return dVar30;
}

Assistant:

double ChSolverPJacobi::Solve(ChSystemDescriptor& sysd) {
    std::vector<ChConstraint*>& mconstraints = sysd.GetConstraintsList();
    std::vector<ChVariables*>& mvariables = sysd.GetVariablesList();

    m_iterations = 0;
    maxviolation = 0;
    double maxdeltalambda = 0;
    int i_friction_comp = 0;
    double old_lambda_friction[3];

    // 1)  Update auxiliary data in all constraints before starting,
    //     that is: g_i=[Cq_i]*[invM_i]*[Cq_i]' and  [Eq_i]=[invM_i]*[Cq_i]'
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
        mconstraints[ic]->Update_auxiliary();

    // Average all g_i for the triplet of contact constraints n,u,v.
    //
    int j_friction_comp = 0;
    double gi_values[3];
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
        if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
            gi_values[j_friction_comp] = mconstraints[ic]->Get_g_i();
            j_friction_comp++;
            if (j_friction_comp == 3) {
                double average_g_i = (gi_values[0] + gi_values[1] + gi_values[2]) / 3.0;
                mconstraints[ic - 2]->Set_g_i(average_g_i);
                mconstraints[ic - 1]->Set_g_i(average_g_i);
                mconstraints[ic - 0]->Set_g_i(average_g_i);
                j_friction_comp = 0;
            }
        }
    }

    // 2)  Compute, for all items with variables, the initial guess for
    //     still unconstrained system:

    for (unsigned int iv = 0; iv < mvariables.size(); iv++)
        if (mvariables[iv]->IsActive())
            mvariables[iv]->Compute_invMb_v(mvariables[iv]->Get_qb(), mvariables[iv]->Get_fb());  // q = [M]'*fb

    // 3)  For all items with variables, add the effect of initial (guessed)
    //     lagrangian reactions of constraints, if a warm start is desired.
    //     Otherwise, if no warm start, simply resets initial lagrangians to zero.
    if (m_warm_start) {
    } else {
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            mconstraints[ic]->Set_l_i(0.);
    }

    // 4)  Perform the iteration loops
    //

    std::vector<double> delta_gammas;
    delta_gammas.resize(mconstraints.size());

    for (int iter = 0; iter < m_max_iterations; iter++) {
        // The iteration on all constraints
        //

        maxviolation = 0;
        maxdeltalambda = 0;

        for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
            // skip computations if constraint not active.
            if (mconstraints[ic]->IsActive()) {
                // compute residual  c_i = [Cq_i]*q + b_i + cfm_i*l_i
                double mresidual = mconstraints[ic]->Compute_Cq_q() + mconstraints[ic]->Get_b_i() +
                                   mconstraints[ic]->Get_cfm_i() * mconstraints[ic]->Get_l_i();

                // true constraint violation may be different from 'mresidual' (ex:clamped if unilateral)
                double candidate_violation = fabs(mconstraints[ic]->Violation(mresidual));

                // compute:  delta_lambda = -(omega/g_i) * ([Cq_i]*q + b_i + cfm_i*l_i )
                double deltal = (m_omega / mconstraints[ic]->Get_g_i()) * (-mresidual);

                if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
                    candidate_violation = 0;

                    // update:   lambda += delta_lambda;
                    old_lambda_friction[i_friction_comp] = mconstraints[ic]->Get_l_i();
                    mconstraints[ic]->Set_l_i(old_lambda_friction[i_friction_comp] + deltal);
                    i_friction_comp++;

                    if (i_friction_comp == 1)
                        candidate_violation = fabs(ChMin(0.0, mresidual));

                    if (i_friction_comp == 3) {
                        mconstraints[ic - 2]->Project();  // the N normal component will take care of N,U,V
                        double new_lambda_0 = mconstraints[ic - 2]->Get_l_i();
                        double new_lambda_1 = mconstraints[ic - 1]->Get_l_i();
                        double new_lambda_2 = mconstraints[ic - 0]->Get_l_i();
                        // Apply the smoothing: lambda= sharpness*lambda_new_projected + (1-sharpness)*lambda_old
                        if (m_shlambda != 1.0) {
                            new_lambda_0 = m_shlambda * new_lambda_0 + (1.0 - m_shlambda) * old_lambda_friction[0];
                            new_lambda_1 = m_shlambda * new_lambda_1 + (1.0 - m_shlambda) * old_lambda_friction[1];
                            new_lambda_2 = m_shlambda * new_lambda_2 + (1.0 - m_shlambda) * old_lambda_friction[2];
                            mconstraints[ic - 2]->Set_l_i(new_lambda_0);
                            mconstraints[ic - 1]->Set_l_i(new_lambda_1);
                            mconstraints[ic - 0]->Set_l_i(new_lambda_2);
                        }
                        delta_gammas[ic - 2] = new_lambda_0 - old_lambda_friction[0];
                        delta_gammas[ic - 1] = new_lambda_1 - old_lambda_friction[1];
                        delta_gammas[ic - 0] = new_lambda_2 - old_lambda_friction[2];
                        // Now do NOT update the primal variables , posticipate
                        // mconstraints[xx]->Increment_q(true_delta_xx);

                        if (this->record_violation_history) {
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(delta_gammas[ic - 2]));
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(delta_gammas[ic - 1]));
                            maxdeltalambda = ChMax(maxdeltalambda, fabs(delta_gammas[ic - 0]));
                        }
                        i_friction_comp = 0;
                    }
                } else {
                    // update:   lambda += delta_lambda;
                    double old_lambda = mconstraints[ic]->Get_l_i();
                    mconstraints[ic]->Set_l_i(old_lambda + deltal);

                    // If new lagrangian multiplier does not satisfy inequalities, project
                    // it into an admissible orthant (or, in general, onto an admissible set)
                    mconstraints[ic]->Project();

                    // After projection, the lambda may have changed a bit..
                    double new_lambda = mconstraints[ic]->Get_l_i();

                    // Apply the smoothing: lambda= sharpness*lambda_new_projected + (1-sharpness)*lambda_old
                    if (m_shlambda != 1.0) {
                        new_lambda = m_shlambda * new_lambda + (1.0 - m_shlambda) * old_lambda;
                        mconstraints[ic]->Set_l_i(new_lambda);
                    }

                    // Now do NOT update the primal variables , posticipate
                    // mconstraints[ic]->Increment_q(true_delta_xx);
                    delta_gammas[ic] = new_lambda - old_lambda;

                    if (this->record_violation_history)
                        maxdeltalambda = ChMax(maxdeltalambda, fabs(delta_gammas[ic]));
                }

                maxviolation = ChMax(maxviolation, fabs(candidate_violation));
            }
        }

        // Now, after all deltas are updated, sweep through all constraints and increment  q += [invM][Cq]'* delta_l
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
            if (mconstraints[ic]->IsActive())
                mconstraints[ic]->Increment_q(delta_gammas[ic]);
        }

        // For recording into violation history, if debugging
        if (this->record_violation_history)
            AtIterationEnd(maxviolation, maxdeltalambda, iter);

        m_iterations++;

        // Terminate the loop if violation in constraints has been successfully limited.
        if (maxviolation < m_tolerance)
            break;
    }

    return maxviolation;
}